

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_array_add_strkey_elem(jx9_value *pArray,char *zKey,jx9_value *pValue)

{
  sxu32 nLen;
  undefined1 local_70 [8];
  jx9_value sKey;
  int rc;
  jx9_value *pValue_local;
  char *zKey_local;
  jx9_value *pArray_local;
  
  if ((pArray->iFlags & 0x40U) == 0) {
    pArray_local._4_4_ = -0x18;
  }
  else {
    if ((zKey == (char *)0x0) || (*zKey == '\0')) {
      sKey._60_4_ = jx9HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pValue);
    }
    else {
      jx9MemObjInitFromString(pArray->pVm,(jx9_value *)local_70,(SyString *)0x0);
      nLen = SyStrlen(zKey);
      jx9MemObjStringAppend((jx9_value *)local_70,zKey,nLen);
      sKey._60_4_ = jx9HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)local_70,pValue)
      ;
      jx9MemObjRelease((jx9_value *)local_70);
    }
    pArray_local._4_4_ = sKey._60_4_;
  }
  return pArray_local._4_4_;
}

Assistant:

JX9_PRIVATE int jx9_array_add_strkey_elem(jx9_value *pArray, const char *zKey, jx9_value *pValue)
{
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return JX9_CORRUPT;
	}
	/* Perform the insertion */
	if( SX_EMPTY_STR(zKey) ){
		/* Empty key, assign an automatic index */
		rc = jx9HashmapInsert((jx9_hashmap *)pArray->x.pOther, 0, &(*pValue));
	}else{
		jx9_value sKey;
		jx9MemObjInitFromString(pArray->pVm, &sKey, 0);
		jx9MemObjStringAppend(&sKey, zKey, (sxu32)SyStrlen(zKey));
		rc = jx9HashmapInsert((jx9_hashmap *)pArray->x.pOther, &sKey, &(*pValue));
		jx9MemObjRelease(&sKey);
	}
	return rc;
}